

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-test.cc
# Opt level: O0

void __thiscall ProblemTest_AddObj_Test::TestBody(ProblemTest_AddObj_Test *this)

{
  bool bVar1;
  int iVar2;
  LinearExpr *this_00;
  pointer pTVar3;
  LinearExpr *expected_expression;
  const_iterator actual_expression;
  MutObjective MVar4;
  Objective OVar5;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  int i;
  const_iterator it;
  AssertionResult gtest_ar_9;
  int num_terms;
  double coefs [2];
  int indices [2];
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  LinearObjBuilder builder;
  NumericConstant nl_expr;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_2;
  Objective obj;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Problem p;
  undefined4 in_stack_fffffffffffff6e8;
  int in_stack_fffffffffffff6ec;
  BasicProblem<mp::BasicProblemParams<int>_> *in_stack_fffffffffffff6f0;
  undefined4 in_stack_fffffffffffff6f8;
  int in_stack_fffffffffffff6fc;
  ExprBase in_stack_fffffffffffff700;
  BasicProblem<mp::BasicProblemParams<int>_> *in_stack_fffffffffffff708;
  int line;
  BasicProblem<mp::BasicProblemParams<int>_> *in_stack_fffffffffffff710;
  Type in_stack_fffffffffffff71c;
  AssertHelper *in_stack_fffffffffffff720;
  char *in_stack_fffffffffffff750;
  char *in_stack_fffffffffffff758;
  char *in_stack_fffffffffffff760;
  undefined4 in_stack_fffffffffffff768;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffff76c;
  AssertHelper *in_stack_fffffffffffff770;
  int in_stack_fffffffffffff798;
  Type in_stack_fffffffffffff79c;
  BasicProblem<mp::BasicProblemParams<int>_> *in_stack_fffffffffffff7a0;
  ExprBase in_stack_fffffffffffff7a8;
  AssertionResult local_718 [2];
  double local_6f8;
  AssertionResult local_6f0 [2];
  int local_6cc;
  AssertionResult local_6c8;
  int local_6b4;
  small_vector_iterator<const_mp::LinearExpr::Term_*,_long> local_6b0 [3];
  int local_694;
  AssertionResult local_690;
  int local_67c;
  AssertHelper local_678 [5];
  Type local_650;
  undefined4 local_64c;
  AssertionResult local_648;
  BasicProblem<mp::BasicProblemParams<int>_> *local_638;
  int local_630;
  BasicProblem<mp::BasicProblemParams<int>_> *local_628;
  int local_620;
  BasicProblem<mp::BasicProblemParams<int>_> *local_618;
  int local_610;
  BasicProblem<mp::BasicProblemParams<int>_> *local_608;
  int local_600;
  int local_5e8;
  undefined4 local_5e4;
  AssertionResult local_5e0;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1> local_5d0;
  LinearExpr *local_5c0;
  Impl *local_5b8;
  int local_5a0;
  undefined4 local_59c;
  AssertionResult local_598;
  string local_588 [48];
  ExprBase local_558;
  AssertionResult local_550 [2];
  Type local_530;
  undefined4 local_52c;
  AssertionResult local_528;
  BasicProblem<mp::BasicProblemParams<int>_> *local_518;
  int local_510;
  BasicProblem<mp::BasicProblemParams<int>_> *local_508;
  int local_500;
  BasicProblem<mp::BasicProblemParams<int>_> *local_4f8;
  int local_4f0;
  BasicProblem<mp::BasicProblemParams<int>_> *local_4e8;
  int local_4e0;
  int local_4c8;
  undefined4 local_4c4;
  AssertionResult local_4c0;
  LinearExpr *local_4b0;
  int local_490;
  undefined4 local_48c;
  AssertionResult local_488;
  string local_478 [48];
  ExprBase local_448;
  AssertionResult local_440 [2];
  Type local_420;
  undefined4 local_41c;
  AssertionResult local_418;
  BasicProblem<mp::BasicProblemParams<int>_> *local_408;
  int local_400;
  BasicProblem<mp::BasicProblemParams<int>_> *local_3f8;
  int local_3f0;
  BasicProblem<mp::BasicProblemParams<int>_> *local_3e8;
  int local_3e0;
  BasicProblem<mp::BasicProblemParams<int>_> *local_3d8;
  int local_3d0;
  int local_3b8;
  undefined4 local_3b4;
  AssertionResult local_3b0;
  LinearExpr *local_3a0;
  int local_378;
  undefined4 local_374;
  AssertionResult local_370 [55];
  
  mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblem(in_stack_fffffffffffff710);
  local_374 = 0;
  local_378 = mp::BasicProblem<mp::BasicProblemParams<int>_>::num_objs
                        ((BasicProblem<mp::BasicProblemParams<int>_> *)0x11848c);
  testing::internal::EqHelper<true>::Compare<int,int>
            ((char *)in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700.impl_,
             (int *)CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8),
             (int *)in_stack_fffffffffffff6f0,
             (type *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_370);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff720);
    testing::AssertionResult::failure_message((AssertionResult *)0x11853b);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff720,in_stack_fffffffffffff71c,(char *)in_stack_fffffffffffff710
               ,(int)((ulong)in_stack_fffffffffffff708 >> 0x20),
               (char *)in_stack_fffffffffffff700.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff770,
               (Message *)CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff6f0);
    testing::Message::~Message((Message *)0x11859e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1185f6);
  local_3a0 = (LinearExpr *)
              mp::BasicProblem<mp::BasicProblemParams<int>_>::AddObj
                        (in_stack_fffffffffffff708,
                         (Type)((ulong)in_stack_fffffffffffff700.impl_ >> 0x20),
                         (int)in_stack_fffffffffffff700.impl_);
  local_3b4 = 1;
  local_3b8 = mp::BasicProblem<mp::BasicProblemParams<int>_>::num_objs
                        ((BasicProblem<mp::BasicProblemParams<int>_> *)0x118639);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700.impl_,
             (int *)CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8),
             (int *)in_stack_fffffffffffff6f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3b0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff720);
    testing::AssertionResult::failure_message((AssertionResult *)0x1186dc);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff720,in_stack_fffffffffffff71c,(char *)in_stack_fffffffffffff710
               ,(int)((ulong)in_stack_fffffffffffff708 >> 0x20),
               (char *)in_stack_fffffffffffff700.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff770,
               (Message *)CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff6f0);
    testing::Message::~Message((Message *)0x11873f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x118797);
  MVar4 = mp::BasicProblem<mp::BasicProblemParams<int>_>::obj
                    ((BasicProblem<mp::BasicProblemParams<int>_> *)in_stack_fffffffffffff700.impl_,
                     in_stack_fffffffffffff6fc);
  local_3f8 = MVar4.
              super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  local_3f0 = MVar4.
              super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  local_3e8 = local_3f8;
  local_3e0 = local_3f0;
  OVar5 = mp::BasicProblem::MutObjective::operator_cast_to_BasicObjective((MutObjective *)0x118800);
  local_408 = OVar5.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
              problem_;
  local_400 = OVar5.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
              index_;
  local_41c = 0;
  local_3d8 = local_408;
  local_3d0 = local_400;
  local_420 = mp::BasicProblem<mp::BasicProblemParams<int>_>::
              BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              ::type((BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                      *)0x118865);
  testing::internal::EqHelper<false>::Compare<mp::obj::Type,mp::obj::Type>
            ((char *)in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700.impl_,
             (Type *)CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8),
             (Type *)in_stack_fffffffffffff6f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_418);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff720);
    testing::AssertionResult::failure_message((AssertionResult *)0x118918);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff720,in_stack_fffffffffffff71c,(char *)in_stack_fffffffffffff710
               ,(int)((ulong)in_stack_fffffffffffff708 >> 0x20),
               (char *)in_stack_fffffffffffff700.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff770,
               (Message *)CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff6f0);
    testing::Message::~Message((Message *)0x11897b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1189d3);
  local_448.impl_ =
       (Impl *)mp::BasicProblem<mp::BasicProblemParams<int>_>::
               BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
               ::nonlinear_expr((BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                                 *)CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8));
  mp::internal::ExprBase::operator_cast_to_function_pointer(&local_448);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)in_stack_fffffffffffff6f0,
             SUB41((uint)in_stack_fffffffffffff6ec >> 0x18,0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_440);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff720);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768),
               in_stack_fffffffffffff760,in_stack_fffffffffffff758,in_stack_fffffffffffff750);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff720,in_stack_fffffffffffff71c,(char *)in_stack_fffffffffffff710
               ,(int)((ulong)in_stack_fffffffffffff708 >> 0x20),
               (char *)in_stack_fffffffffffff700.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff770,
               (Message *)CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff6f0);
    std::__cxx11::string::~string(local_478);
    testing::Message::~Message((Message *)0x118b2d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x118ba8);
  local_48c = 0;
  mp::BasicProblem<mp::BasicProblemParams<int>_>::
  BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  ::linear_expr((BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                 *)0x118bc0);
  local_490 = mp::LinearExpr::num_terms((LinearExpr *)0x118bd7);
  testing::internal::EqHelper<true>::Compare<int,int>
            ((char *)in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700.impl_,
             (int *)CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8),
             (int *)in_stack_fffffffffffff6f0,
             (type *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_488);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff720);
    testing::AssertionResult::failure_message((AssertionResult *)0x118c8f);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff720,in_stack_fffffffffffff71c,(char *)in_stack_fffffffffffff710
               ,(int)((ulong)in_stack_fffffffffffff708 >> 0x20),
               (char *)in_stack_fffffffffffff700.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff770,
               (Message *)CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff6f0);
    testing::Message::~Message((Message *)0x118cf2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x118d4a);
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)0x118d57);
  local_4b0 = (LinearExpr *)
              mp::BasicProblem<mp::BasicProblemParams<int>_>::AddObj
                        (in_stack_fffffffffffff7a0,in_stack_fffffffffffff79c,
                         (NumericExpr)in_stack_fffffffffffff7a8.impl_,in_stack_fffffffffffff798);
  local_4c4 = 2;
  local_4c8 = mp::BasicProblem<mp::BasicProblemParams<int>_>::num_objs
                        ((BasicProblem<mp::BasicProblemParams<int>_> *)0x118da7);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700.impl_,
             (int *)CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8),
             (int *)in_stack_fffffffffffff6f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4c0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff720);
    testing::AssertionResult::failure_message((AssertionResult *)0x118e4a);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff720,in_stack_fffffffffffff71c,(char *)in_stack_fffffffffffff710
               ,(int)((ulong)in_stack_fffffffffffff708 >> 0x20),
               (char *)in_stack_fffffffffffff700.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff770,
               (Message *)CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff6f0);
    testing::Message::~Message((Message *)0x118ead);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x118f05);
  MVar4 = mp::BasicProblem<mp::BasicProblemParams<int>_>::obj
                    ((BasicProblem<mp::BasicProblemParams<int>_> *)in_stack_fffffffffffff700.impl_,
                     in_stack_fffffffffffff6fc);
  local_508 = MVar4.
              super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  local_500 = MVar4.
              super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  local_4f8 = local_508;
  local_4f0 = local_500;
  OVar5 = mp::BasicProblem::MutObjective::operator_cast_to_BasicObjective((MutObjective *)0x118f71);
  local_518 = OVar5.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
              problem_;
  local_510 = OVar5.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
              index_;
  local_52c = 1;
  local_4e8 = local_518;
  local_4e0 = local_510;
  local_3d8 = local_518;
  local_3d0 = local_510;
  local_530 = mp::BasicProblem<mp::BasicProblemParams<int>_>::
              BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              ::type((BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                      *)0x118ff4);
  testing::internal::EqHelper<false>::Compare<mp::obj::Type,mp::obj::Type>
            ((char *)in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700.impl_,
             (Type *)CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8),
             (Type *)in_stack_fffffffffffff6f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_528);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff720);
    testing::AssertionResult::failure_message((AssertionResult *)0x1190a7);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff720,in_stack_fffffffffffff71c,(char *)in_stack_fffffffffffff710
               ,(int)((ulong)in_stack_fffffffffffff708 >> 0x20),
               (char *)in_stack_fffffffffffff700.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff770,
               (Message *)CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff6f0);
    testing::Message::~Message((Message *)0x11910a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x119162);
  local_558.impl_ =
       (Impl *)mp::BasicProblem<mp::BasicProblemParams<int>_>::
               BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
               ::nonlinear_expr((BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                                 *)CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8));
  mp::internal::ExprBase::operator_cast_to_function_pointer(&local_558);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)in_stack_fffffffffffff6f0,
             SUB41((uint)in_stack_fffffffffffff6ec >> 0x18,0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_550);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff720);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768),
               in_stack_fffffffffffff760,in_stack_fffffffffffff758,in_stack_fffffffffffff750);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff720,in_stack_fffffffffffff71c,(char *)in_stack_fffffffffffff710
               ,(int)((ulong)in_stack_fffffffffffff708 >> 0x20),
               (char *)in_stack_fffffffffffff700.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff770,
               (Message *)CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff6f0);
    std::__cxx11::string::~string(local_588);
    testing::Message::~Message((Message *)0x1192bc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x119337);
  local_59c = 0;
  mp::BasicProblem<mp::BasicProblemParams<int>_>::
  BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  ::linear_expr((BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                 *)0x11934f);
  local_5a0 = mp::LinearExpr::num_terms((LinearExpr *)0x119366);
  testing::internal::EqHelper<true>::Compare<int,int>
            ((char *)in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700.impl_,
             (int *)CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8),
             (int *)in_stack_fffffffffffff6f0,
             (type *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_598);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff720);
    testing::AssertionResult::failure_message((AssertionResult *)0x11941e);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff720,in_stack_fffffffffffff71c,(char *)in_stack_fffffffffffff710
               ,(int)((ulong)in_stack_fffffffffffff708 >> 0x20),
               (char *)in_stack_fffffffffffff700.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff770,
               (Message *)CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff6f0);
    testing::Message::~Message((Message *)0x119481);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1194d9);
  local_5d0.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant
                 ((BasicExprFactory<std::allocator<char>_> *)
                  CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8),
                  (double)in_stack_fffffffffffff6f0);
  local_5b8 = (Impl *)local_5d0.super_ExprBase.impl_;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8),
             (NumericConstant)in_stack_fffffffffffff700.impl_,
             (type_conflict)((ulong)in_stack_fffffffffffff6f0 >> 0x20));
  local_5c0 = (LinearExpr *)
              mp::BasicProblem<mp::BasicProblemParams<int>_>::AddObj
                        (in_stack_fffffffffffff7a0,in_stack_fffffffffffff79c,
                         (NumericExpr)in_stack_fffffffffffff7a8.impl_,in_stack_fffffffffffff798);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::LinearExprBuilder::AddTerm
            ((LinearExprBuilder *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6ec,
             5.6935087488889e-318);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::LinearExprBuilder::AddTerm
            ((LinearExprBuilder *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6ec,
             5.69364708726973e-318);
  local_5e4 = 3;
  local_5e8 = mp::BasicProblem<mp::BasicProblemParams<int>_>::num_objs
                        ((BasicProblem<mp::BasicProblemParams<int>_> *)0x1195b1);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700.impl_,
             (int *)CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8),
             (int *)in_stack_fffffffffffff6f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5e0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff720);
    testing::AssertionResult::failure_message((AssertionResult *)0x119654);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff720,in_stack_fffffffffffff71c,(char *)in_stack_fffffffffffff710
               ,(int)((ulong)in_stack_fffffffffffff708 >> 0x20),
               (char *)in_stack_fffffffffffff700.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff770,
               (Message *)CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff6f0);
    testing::Message::~Message((Message *)0x1196b7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11970f);
  MVar4 = mp::BasicProblem<mp::BasicProblemParams<int>_>::obj
                    ((BasicProblem<mp::BasicProblemParams<int>_> *)in_stack_fffffffffffff700.impl_,
                     in_stack_fffffffffffff6fc);
  local_628 = MVar4.
              super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  local_620 = MVar4.
              super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  local_618 = local_628;
  local_610 = local_620;
  OVar5 = mp::BasicProblem::MutObjective::operator_cast_to_BasicObjective((MutObjective *)0x11977b);
  local_638 = OVar5.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
              problem_;
  local_630 = OVar5.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
              index_;
  local_64c = 0;
  local_608 = local_638;
  local_600 = local_630;
  local_3d8 = local_638;
  local_3d0 = local_630;
  local_650 = mp::BasicProblem<mp::BasicProblemParams<int>_>::
              BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              ::type((BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                      *)0x1197fe);
  testing::internal::EqHelper<false>::Compare<mp::obj::Type,mp::obj::Type>
            ((char *)in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700.impl_,
             (Type *)CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8),
             (Type *)in_stack_fffffffffffff6f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_648);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff720);
    testing::AssertionResult::failure_message((AssertionResult *)0x1198b1);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff720,in_stack_fffffffffffff71c,(char *)in_stack_fffffffffffff710
               ,(int)((ulong)in_stack_fffffffffffff708 >> 0x20),
               (char *)in_stack_fffffffffffff700.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff770,
               (Message *)CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff6f0);
    testing::Message::~Message((Message *)0x119914);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11996c);
  local_678[2].data_ = (AssertHelperData *)0x300000000;
  local_678[0].data_ = (AssertHelperData *)0x3ff199999999999a;
  local_678[1].data_ = (AssertHelperData *)0x400199999999999a;
  local_67c = 2;
  this_00 = mp::BasicProblem<mp::BasicProblemParams<int>_>::
            BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
            ::linear_expr((BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                           *)0x1199a5);
  iVar2 = mp::LinearExpr::num_terms((LinearExpr *)0x1199bc);
  local_694 = iVar2;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700.impl_,
             (int *)CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8),
             (int *)in_stack_fffffffffffff6f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_690);
  uVar6 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff768);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff720);
    testing::AssertionResult::failure_message((AssertionResult *)0x119a6f);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff720,in_stack_fffffffffffff71c,(char *)in_stack_fffffffffffff710
               ,(int)((ulong)in_stack_fffffffffffff708 >> 0x20),
               (char *)in_stack_fffffffffffff700.impl_);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)this_00,(Message *)CONCAT44(iVar2,uVar6));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff6f0);
    testing::Message::~Message((Message *)0x119acc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x119b24);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::
  BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  ::linear_expr((BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                 *)0x119b31);
  local_6b0[0].m_ptr =
       (Term *)mp::LinearExpr::begin
                         ((LinearExpr *)
                          CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
  local_6b4 = 0;
  while (local_6b4 < local_67c) {
    pTVar3 = gch::small_vector_iterator<const_mp::LinearExpr::Term_*,_long>::operator->
                       ((small_vector_iterator<const_mp::LinearExpr::Term_*,_long> *)0x119b97);
    local_6cc = mp::LinearExpr::Term::var_index(pTVar3);
    testing::internal::EqHelper<false>::Compare<int,int>
              ((char *)in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700.impl_,
               (int *)CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8),
               (int *)in_stack_fffffffffffff6f0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_6c8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff720);
      testing::AssertionResult::failure_message((AssertionResult *)0x119c43);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffff720,in_stack_fffffffffffff71c,
                 (char *)in_stack_fffffffffffff710,(int)((ulong)in_stack_fffffffffffff708 >> 0x20),
                 (char *)in_stack_fffffffffffff700.impl_);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,(Message *)CONCAT44(iVar2,uVar6));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff6f0);
      testing::Message::~Message((Message *)0x119ca0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x119cf8);
    in_stack_fffffffffffff720 = local_678 + local_6b4;
    pTVar3 = gch::small_vector_iterator<const_mp::LinearExpr::Term_*,_long>::operator->
                       ((small_vector_iterator<const_mp::LinearExpr::Term_*,_long> *)0x119d1a);
    local_6f8 = mp::LinearExpr::Term::coef(pTVar3);
    testing::internal::EqHelper<false>::Compare<double,double>
              ((char *)in_stack_fffffffffffff708,(char *)in_stack_fffffffffffff700.impl_,
               (double *)CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8),
               (double *)in_stack_fffffffffffff6f0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_6f0);
    in_stack_fffffffffffff71c = CONCAT13(bVar1,(int3)in_stack_fffffffffffff71c);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff720);
      in_stack_fffffffffffff710 =
           (BasicProblem<mp::BasicProblemParams<int>_> *)
           testing::AssertionResult::failure_message((AssertionResult *)0x119dcc);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffff720,in_stack_fffffffffffff71c,
                 (char *)in_stack_fffffffffffff710,(int)((ulong)in_stack_fffffffffffff708 >> 0x20),
                 (char *)in_stack_fffffffffffff700.impl_);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,(Message *)CONCAT44(iVar2,uVar6));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff6f0);
      testing::Message::~Message((Message *)0x119e29);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x119e7e);
    local_6b4 = local_6b4 + 1;
    gch::small_vector_iterator<const_mp::LinearExpr::Term_*,_long>::operator++(local_6b0);
  }
  expected_expression =
       mp::BasicProblem<mp::BasicProblemParams<int>_>::
       BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       ::linear_expr((BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                      *)0x119ec0);
  actual_expression =
       mp::LinearExpr::end((LinearExpr *)
                           CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
  testing::internal::EqHelper<false>::
  Compare<gch::small_vector_iterator<mp::LinearExpr::Term_const*,long>,gch::small_vector_iterator<mp::LinearExpr::Term_const*,long>>
            ((char *)expected_expression,(char *)actual_expression.m_ptr,
             (small_vector_iterator<const_mp::LinearExpr::Term_*,_long> *)
             CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8),
             (small_vector_iterator<const_mp::LinearExpr::Term_*,_long> *)in_stack_fffffffffffff6f0)
  ;
  line = (int)((ulong)expected_expression >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_718);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff720);
    in_stack_fffffffffffff6f0 =
         (BasicProblem<mp::BasicProblemParams<int>_> *)
         testing::AssertionResult::failure_message((AssertionResult *)0x119f69);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff720,in_stack_fffffffffffff71c,(char *)in_stack_fffffffffffff710
               ,line,(char *)actual_expression.m_ptr);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)this_00,(Message *)CONCAT44(iVar2,uVar6));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff6f0);
    testing::Message::~Message((Message *)0x119fc6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11a01b);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::~BasicProblem(in_stack_fffffffffffff6f0);
  return;
}

Assistant:

TEST(ProblemTest, AddObj) {
  Problem p;
  EXPECT_EQ(0, p.num_objs());

  p.AddObj(mp::obj::MIN);
  EXPECT_EQ(1, p.num_objs());
  Problem::Objective obj = p.obj(0);
  EXPECT_EQ(mp::obj::MIN, obj.type());
  EXPECT_TRUE(!obj.nonlinear_expr());
  EXPECT_EQ(0, obj.linear_expr().num_terms());

  p.AddObj(mp::obj::MAX, mp::NumericExpr());
  EXPECT_EQ(2, p.num_objs());
  obj = p.obj(1);
  EXPECT_EQ(mp::obj::MAX, obj.type());
  EXPECT_TRUE(!obj.nonlinear_expr());
  EXPECT_EQ(0, obj.linear_expr().num_terms());

  auto nl_expr = p.MakeNumericConstant(42);
  Problem::LinearObjBuilder builder = p.AddObj(mp::obj::MIN, nl_expr);
  builder.AddTerm(0, 1.1);
  builder.AddTerm(3, 2.2);
  EXPECT_EQ(3, p.num_objs());
  obj = p.obj(2);
  EXPECT_EQ(mp::obj::MIN, obj.type());
  const int indices[] = {0, 3};
  const double coefs[] = {1.1, 2.2};
  EXPECT_LINEAR_EXPR(obj.linear_expr(), indices, coefs);
}